

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O0

int lj_ffh_bit_bswap(lua_State *L)

{
  uint64_t x_00;
  lua_State *in_RDI;
  CTypeID *unaff_retaddr;
  uint64_t x;
  lua_State *in_stack_00000010;
  CTypeID id;
  undefined4 local_24;
  CTypeID id_00;
  
  id_00 = 0;
  x_00 = lj_carith_check64(in_stack_00000010,x._4_4_,unaff_retaddr);
  if (id_00 == 0) {
    local_24 = 0;
  }
  else {
    local_24 = bit_result64(in_RDI,id_00,x_00);
  }
  return local_24;
}

Assistant:

LJLIB_ASM(bit_bswap)		LJLIB_REC(bit_unary IR_BSWAP)
{
#if LJ_HASFFI
  CTypeID id = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  return id ? bit_result64(L, id, lj_bswap64(x)) : FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  return FFH_RETRY;
#endif
}